

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O1

void wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::
     doVisitLocalGet(SpillPointers *self,Expression **currp)

{
  LocalGet *curr;
  BasicBlock *pBVar1;
  Block *pBVar2;
  initializer_list<wasm::Expression_*> local_40;
  Expression *local_30;
  Builder local_28;
  Builder builder;
  Expression **currp_local;
  
  curr = (LocalGet *)*currp;
  builder.wasm = (Module *)currp;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id == LocalGetId)
  {
    pBVar1 = (self->
             super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
             ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
             super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
             .currBasicBlock;
    if (pBVar1 == (BasicBlock *)0x0) {
      local_28.wasm =
           (self->
           super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
           ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
           super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
           .super_ControlFlowWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
           super_PostWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
           super_Walker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.currModule;
      pBVar2 = (Block *)Builder::replaceWithIdenticalType<wasm::LocalGet>(&local_28,curr);
      if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
          LocalGetId) {
        local_30 = (Expression *)MixedArena::allocSpace(&(local_28.wasm)->allocator,0x10,8);
        local_30->_id = UnreachableId;
        (local_30->type).id = 1;
        local_40._M_array = &local_30;
        local_40._M_len = 1;
        pBVar2 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                           (&local_28,&local_40,
                            (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)8>).
                                  super_Expression.type.id);
      }
      ((builder.wasm)->exports).
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar2;
    }
    else {
      local_40._M_array = (iterator)((ulong)local_40._M_array & 0xffffffff00000000);
      std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
      emplace_back<wasm::LivenessAction::What,unsigned_int&,wasm::Expression**&>
                ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
                 &(pBVar1->contents).actions,(What *)&local_40,&curr->index,(Expression ***)&builder
                );
    }
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                ,0x314,"T *wasm::Expression::cast() [T = wasm::LocalGet]");
}

Assistant:

static void doVisitLocalGet(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<LocalGet>();
    // if in unreachable code, ignore
    if (!self->currBasicBlock) {
      Builder builder(*self->getModule());
      auto* rep = builder.replaceWithIdenticalType(curr);
      if (rep->is<LocalGet>()) {
        // We failed to replace the node with something simpler. This can happen
        // if the local is non-nullable, for example. We still need to remove
        // this node entirely, however, as it is unreachable and so we will not
        // see it in the analysis we perform (for example, we may be changing
        // local indexes). Replace it with something completely different, even
        // if it is larger, a block with a forced type that has unreachable
        // contents,
        //
        //  (block (result X)
        //   (unreachable))
        //
        // That pattern lets us set any type we wish.
        //
        // TODO: Make a helper function for this, if it is useful in other
        //       places.
        rep = builder.makeBlock({builder.makeUnreachable()}, curr->type);
      }
      *currp = rep;
      return;
    }
    self->currBasicBlock->contents.actions.emplace_back(
      LivenessAction::Get, curr->index, currp);
  }